

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

char * mpack_read_utf8_inplace(mpack_reader_t *reader,size_t count)

{
  _Bool _Var1;
  mpack_error_t mVar2;
  char *str;
  size_t count_local;
  mpack_reader_t *reader_local;
  
  mpack_reader_track_str_bytes_all(reader,count);
  reader_local = (mpack_reader_t *)mpack_read_bytes_inplace_notrack(reader,count);
  mVar2 = mpack_reader_error(reader);
  if ((mVar2 == mpack_ok) && (_Var1 = mpack_utf8_check((char *)reader_local,count), !_Var1)) {
    mpack_reader_flag_error(reader,mpack_error_type);
    reader_local = (mpack_reader_t *)0x0;
  }
  return (char *)reader_local;
}

Assistant:

const char* mpack_read_utf8_inplace(mpack_reader_t* reader, size_t count) {
    mpack_reader_track_str_bytes_all(reader, count);
    const char* str = mpack_read_bytes_inplace_notrack(reader, count);

    if (mpack_reader_error(reader) == mpack_ok && !mpack_utf8_check(str, count)) {
        mpack_reader_flag_error(reader, mpack_error_type);
        return NULL;
    }

    return str;
}